

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O0

void __thiscall
absl::lts_20240722::container_internal::HashSetResizeHelper::
GrowIntoSingleGroupShuffleTransferableSlots
          (HashSetResizeHelper *this,void *new_slots,size_t slot_size)

{
  ulong uVar1;
  void *pvVar2;
  void *__src;
  size_t half_old_capacity;
  size_t slot_size_local;
  void *new_slots_local;
  HashSetResizeHelper *this_local;
  
  if (*(long *)(this + 0x10) != 0) {
    uVar1 = *(ulong *)(this + 0x10) >> 1;
    pvVar2 = old_slots(this);
    SanitizerUnpoisonMemoryRegion(pvVar2,slot_size * *(long *)(this + 0x10));
    pvVar2 = old_slots(this);
    pvVar2 = SlotAddress(pvVar2,uVar1 + 1,slot_size);
    memcpy(new_slots,pvVar2,slot_size * uVar1);
    pvVar2 = SlotAddress(new_slots,uVar1 + 1,slot_size);
    __src = old_slots(this);
    memcpy(pvVar2,__src,slot_size * (uVar1 + 1));
    return;
  }
  __assert_fail("old_capacity_ > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                ,0x1e3,
                "void absl::container_internal::HashSetResizeHelper::GrowIntoSingleGroupShuffleTransferableSlots(void *, size_t) const"
               );
}

Assistant:

void HashSetResizeHelper::GrowIntoSingleGroupShuffleTransferableSlots(
    void* new_slots, size_t slot_size) const {
  assert(old_capacity_ > 0);
  const size_t half_old_capacity = old_capacity_ / 2;

  SanitizerUnpoisonMemoryRegion(old_slots(), slot_size * old_capacity_);
  std::memcpy(new_slots,
              SlotAddress(old_slots(), half_old_capacity + 1, slot_size),
              slot_size * half_old_capacity);
  std::memcpy(SlotAddress(new_slots, half_old_capacity + 1, slot_size),
              old_slots(), slot_size * (half_old_capacity + 1));
}